

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk7_lib.c
# Opt level: O0

int pkcs7_rsa_encrypt_decrypt_setup(PKCS7_RECIP_INFO *ri,int decrypt)

{
  X509_ALGOR *alg_00;
  ASN1_OBJECT *aobj;
  int in_ESI;
  PKCS7_RECIP_INFO *in_RDI;
  X509_ALGOR *alg;
  X509_ALGOR *local_18 [3];
  
  local_18[0] = (X509_ALGOR *)0x0;
  if ((in_ESI == 0) &&
     (PKCS7_RECIP_INFO_get0_alg(in_RDI,local_18), alg_00 = local_18[0],
     local_18[0] != (X509_ALGOR *)0x0)) {
    aobj = OBJ_nid2obj(6);
    X509_ALGOR_set0(alg_00,aobj,5,(void *)0x0);
  }
  return 1;
}

Assistant:

static int pkcs7_rsa_encrypt_decrypt_setup(PKCS7_RECIP_INFO *ri, int decrypt)
{
    X509_ALGOR *alg = NULL;

    if (decrypt == 0) {
        PKCS7_RECIP_INFO_get0_alg(ri, &alg);
        if (alg != NULL)
            X509_ALGOR_set0(alg, OBJ_nid2obj(NID_rsaEncryption), V_ASN1_NULL, 0);
    }
    return 1;
}